

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::TextFormat::Finder::FindExtension(Finder *this,Message *message,string *name)

{
  FieldDescriptor *pFVar1;
  
  pFVar1 = anon_unknown_14::DefaultFinderFindExtension(message,name);
  return pFVar1;
}

Assistant:

const FieldDescriptor* TextFormat::Finder::FindExtension(
    Message* message, const std::string& name) const {
  return DefaultFinderFindExtension(message, name);
}